

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::tableDecl(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp13_AST;
  RefAST tmp12_AST;
  RefAST tmp11_AST;
  RefAST tableDecl_AST;
  ASTPair currentAST;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  RefCount<AST> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  ASTFactory *in_stack_fffffffffffffe48;
  ASTFactory *this_00;
  Parser *in_stack_fffffffffffffe50;
  ASTPair *in_stack_fffffffffffffe58;
  ASTPair *currentAST_00;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  NoViableAltException *in_stack_fffffffffffffe90;
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  GrpParser *in_stack_ffffffffffffff40;
  GrpParser *in_stack_ffffffffffffff60;
  GrpParser *in_stack_ffffffffffffff90;
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  ASTPair::ASTPair((ASTPair *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffe48,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  RefCount<Token>::~RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  ASTFactory::makeASTRoot
            ((ASTFactory *)in_stack_fffffffffffffe50,(ASTPair *)in_stack_fffffffffffffe48,
             (RefAST *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  iVar2 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  Parser::match(in_stack_fffffffffffffe50,iVar2);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x10)) {
    tableName(in_stack_ffffffffffffff60);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  else {
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x17)) {
      tableGlyph(in_stack_ffffffffffffff60);
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
      RefCount<AST>::~RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    }
    else {
      iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x22)) {
        tableFeature(in_stack_ffffffffffffff60);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        ASTFactory::addASTChild
                  ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      else {
        iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
        if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x23)) {
          tableLanguage(in_stack_ffffffffffffff60);
          RefCount<AST>::RefCount
                    ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
          ;
          ASTFactory::addASTChild
                    ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
          RefCount<AST>::~RefCount
                    ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
          ;
        }
        else {
          iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
          if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x25)) {
            tableSub(in_stack_ffffffffffffff40);
            RefCount<AST>::RefCount
                      ((RefCount<AST> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (RefCount<AST> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            ASTFactory::addASTChild
                      ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
            RefCount<AST>::~RefCount
                      ((RefCount<AST> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          }
          else {
            iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
            if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x38)) {
              tableJust(in_stack_ffffffffffffff40);
              in_stack_fffffffffffffe90 = (NoViableAltException *)(in_RDI + 6);
              RefCount<AST>::RefCount
                        ((RefCount<AST> *)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         (RefCount<AST> *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
              ASTFactory::addASTChild
                        ((ASTFactory *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                         ,in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
              RefCount<AST>::~RefCount
                        ((RefCount<AST> *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            }
            else {
              in_stack_fffffffffffffe8c = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
              if ((in_stack_fffffffffffffe8c == 6) &&
                 ((in_stack_fffffffffffffe88 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
                  in_stack_fffffffffffffe88 == 0x39 ||
                  (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x3a)))) {
                tablePos(in_stack_ffffffffffffff90);
                RefCount<AST>::RefCount
                          ((RefCount<AST> *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (RefCount<AST> *)
                           CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
                ASTFactory::addASTChild
                          ((ASTFactory *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
                RefCount<AST>::~RefCount
                          ((RefCount<AST> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
              }
              else {
                iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
                if ((iVar2 == 6) && (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0x3b)
                   ) {
                  tableLineBreak(in_stack_ffffffffffffff40);
                  RefCount<AST>::RefCount
                            ((RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
                  ASTFactory::addASTChild
                            ((ASTFactory *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe58,(RefAST *)in_stack_fffffffffffffe50);
                  RefCount<AST>::~RefCount
                            ((RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
                }
                else {
                  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
                  if ((iVar2 != 6) ||
                     (iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar3 != 0xd)) {
                    uVar5 = __cxa_allocate_exception(0x40);
                    (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff60,in_RDI,1);
                    NoViableAltException::NoViableAltException
                              (in_stack_fffffffffffffe90,
                               (RefToken *)
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
                    __cxa_throw(uVar5,&NoViableAltException::typeinfo,
                                NoViableAltException::~NoViableAltException);
                  }
                  tableOther(in_stack_ffffffffffffff90);
                  currentAST_00 = (ASTPair *)(in_RDI + 6);
                  RefCount<AST>::RefCount
                            ((RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             (RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
                  ASTFactory::addASTChild
                            ((ASTFactory *)CONCAT44(iVar2,iVar3),currentAST_00,
                             (RefAST *)in_stack_fffffffffffffe50);
                  RefCount<AST>::~RefCount
                            ((RefCount<AST> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
                }
              }
            }
          }
        }
      }
    }
  }
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this_00 = (ASTFactory *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff40,in_RDI,1);
  ASTFactory::create(this_00,(RefToken *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  RefCount<Token>::~RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  Parser::match(in_stack_fffffffffffffe50,(int)((ulong)this_00 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 8) {
    uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           in_stack_fffffffffffffe14);
    if (bVar1) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,3);
      in_stack_fffffffffffffe37 =
           BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                          in_stack_fffffffffffffe14);
      if ((bool)in_stack_fffffffffffffe37) {
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        in_stack_fffffffffffffe28 = (RefCount<AST> *)(in_RDI + 6);
        (**(code **)(*in_RDI + 0x28))(local_d8,in_RDI,1);
        ASTFactory::create(this_00,(RefToken *)CONCAT44(iVar2,uVar4));
        iVar2 = (int)((ulong)this_00 >> 0x20);
        RefCount<AST>::operator=
                  ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        RefCount<Token>::~RefCount
                  ((RefCount<Token> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))
        ;
        Parser::match(in_stack_fffffffffffffe50,iVar2);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        goto LAB_001f42e3;
      }
    }
  }
  (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe14);
  if (bVar1) {
    uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(uVar4,in_stack_fffffffffffffe18),
                           in_stack_fffffffffffffe14);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe18);
    if (bVar1) {
      in_stack_fffffffffffffe14 = (**(code **)(*in_RDI + 0x20))(in_RDI,3);
      bVar1 = BitSet::member((BitSet *)CONCAT44(uVar4,uVar6),in_stack_fffffffffffffe14);
      in_stack_fffffffffffffe10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe10);
      if (bVar1) {
LAB_001f42e3:
        RefCount<AST>::operator=
                  ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        RefCount<AST>::operator=
                  ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        ASTPair::~ASTPair((ASTPair *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        return;
      }
    }
  }
  uVar5 = __cxa_allocate_exception(0x40);
  (**(code **)(*in_RDI + 0x28))(local_e0,in_RDI,1);
  NoViableAltException::NoViableAltException
            (in_stack_fffffffffffffe90,
             (RefToken *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  __cxa_throw(uVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableDecl() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableDecl_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp11_AST = nullAST;
		tmp11_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp11_AST);
		match(LITERAL_table);
		{
		if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_name)) {
			tableName();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_glyph)) {
			tableGlyph();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_feature)) {
			tableFeature();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_language)) {
			tableLanguage();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_substitution)) {
			tableSub();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_justification)) {
			tableJust();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_position||LA(2)==LITERAL_positioning)) {
			tablePos();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_linebreak)) {
			tableLineBreak();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==IDENT)) {
			tableOther();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		RefAST tmp12_AST = nullAST;
		tmp12_AST = astFactory.create(LT(1));
		match(LITERAL_endtable);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp13_AST = nullAST;
			tmp13_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_4.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		tableDecl_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_4);
	}
	returnAST = tableDecl_AST;
}